

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Query_PDU::AddSensorType(Minefield_Query_PDU *this,SensorType ST)

{
  undefined2 uVar1;
  iterator __position;
  byte bVar2;
  KUINT16 KVar3;
  KUINT16 KVar4;
  unsigned_short local_a;
  
  local_a = (unsigned_short)ST;
  __position._M_current =
       (this->m_vui16SensorTypes).
       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
              (&this->m_vui16SensorTypes,__position,&local_a);
  }
  else {
    *__position._M_current = local_a;
    (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  uVar1 = (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = uVar1 + 2;
  bVar2 = this->m_ui8NumSensTyp;
  this->m_ui8NumSensTyp = bVar2 + 1;
  bVar2 = bVar2 & 1;
  if ((bVar2 & (this->m_bNeedsPadding ^ 1U)) == 0) {
    KVar3 = uVar1 + 2;
    if (this->m_bNeedsPadding != false) {
      KVar3 = uVar1;
    }
    KVar4 = KVar3 + 2;
    if (bVar2 != 0) {
      KVar4 = KVar3;
    }
    (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = KVar4;
  }
  this->m_bNeedsPadding = (KBOOL)(bVar2 ^ 1);
  return;
}

Assistant:

void Minefield_Query_PDU::AddSensorType( SensorType ST )
{
    m_vui16SensorTypes.push_back( ST );
    m_ui16PDULength += 2; // 16 bit enum. = 2 octets
    ++m_ui8NumSensTyp;
    calcPadding();
}